

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O1

void __thiscall
nvim::Nvim::buf_set_lines
          (Nvim *this,Buffer buffer,Integer start,Integer end,bool strict_indexing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *replacement)

{
  bool strict_indexing_local;
  string local_90;
  Buffer buffer_local;
  Integer end_local;
  Integer start_local;
  variant<_cf2d41c5_> local_58;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  strict_indexing_local = strict_indexing;
  buffer_local = buffer;
  end_local = end;
  start_local = start;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"nvim_buf_set_lines","");
  NvimRPC::
  do_call<long,long,long,bool,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Object *)&local_58,&this->client_,&local_90,&buffer_local,&start_local,&end_local,
             &strict_indexing_local,replacement);
  boost::variant<$cf2d41c5$>::destroy_content(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::buf_set_lines(Buffer buffer, Integer start, Integer end, bool strict_indexing, const std::vector<std::string>& replacement) {
    client_.call("nvim_buf_set_lines", nullptr, buffer, start, end, strict_indexing, replacement);
}